

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_p2sh_tests.cpp
# Opt level: O2

void __thiscall script_p2sh_tests::is::test_method(is *this)

{
  long lVar1;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  first;
  readonly_property65 rVar2;
  bool bVar3;
  CScript *pCVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  span<const_std::byte,_18446744073709551615UL> b;
  const_string file;
  initializer_list<unsigned_char> __l;
  const_string file_00;
  initializer_list<unsigned_char> __l_00;
  const_string file_01;
  initializer_list<unsigned_char> __l_01;
  const_string file_02;
  initializer_list<unsigned_char> __l_02;
  const_string file_03;
  const_string file_04;
  span<const_std::byte,_18446744073709551615UL> b_00;
  span<const_std::byte,_18446744073709551615UL> b_01;
  const_string file_05;
  span<const_std::byte,_18446744073709551615UL> b_02;
  const_string file_06;
  span<const_std::byte,_18446744073709551615UL> b_03;
  const_string file_07;
  check_type cVar7;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  assertion_result local_210;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pushdata4;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pushdata2;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  assertion_result local_138;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_120;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pushdata1;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> direct;
  char *local_c8;
  char *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  char *local_a8;
  char *local_a0;
  CScript not_p2sh;
  CScript p2sh;
  uint160 dummy;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  dummy.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  p2sh.super_CScriptBase._union._16_8_ = 0;
  p2sh.super_CScriptBase._24_8_ = 0;
  p2sh.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  p2sh.super_CScriptBase._union._8_8_ = 0;
  pCVar4 = CScript::operator<<(&p2sh,OP_HASH160);
  ToByteVector<uint160>((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&not_p2sh,&dummy);
  b._M_extent._M_extent_value =
       not_p2sh.super_CScriptBase._union._8_8_ - not_p2sh.super_CScriptBase._union._0_8_;
  b._M_ptr = (pointer)not_p2sh.super_CScriptBase._union.indirect_contents.indirect;
  pCVar4 = CScript::operator<<(pCVar4,b);
  CScript::operator<<(pCVar4,OP_EQUAL);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&not_p2sh);
  local_a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_a0 = "";
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0xe0;
  file.m_begin = (iterator)&local_a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_b8,msg);
  rVar2.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)CScript::IsPayToScriptHash(&p2sh);
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar2.super_readonly_property<bool>.super_class_property<bool>.value;
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  not_p2sh.super_CScriptBase._24_8_ = &direct;
  direct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "p2sh.IsPayToScriptHash()";
  direct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  not_p2sh.super_CScriptBase._union._8_8_ =
       not_p2sh.super_CScriptBase._union._8_8_ & 0xffffffffffffff00;
  not_p2sh.super_CScriptBase._union.indirect_contents.indirect = "<W\x1b";
  not_p2sh.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_c0 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,(lazy_ostream *)&not_p2sh,1,0,WARN,_cVar7,(size_t)&local_c8,0xe0);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  not_p2sh.super_CScriptBase._union._0_2_ = 0x14a9;
  __l._M_len = 2;
  __l._M_array = (iterator)&not_p2sh;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&direct,__l,(allocator_type *)&local_138);
  not_p2sh.super_CScriptBase._union.indirect_contents.indirect =
       (char *)((ulong)not_p2sh.super_CScriptBase._union.indirect_contents.indirect &
               0xffffffffffffff00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
            (&direct,(const_iterator)
                     direct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish,0x14,
             (value_type_conflict3 *)&not_p2sh);
  not_p2sh.super_CScriptBase._union.direct[0] = 0x87;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&direct,(uchar *)&not_p2sh);
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar5;
  file_00.m_end = (iterator)0xe5;
  file_00.m_begin = (iterator)&local_f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_100,
             msg_00);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::
  prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            (&not_p2sh.super_CScriptBase,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )direct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )direct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
  pushdata1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = CScript::IsPayToScriptHash(&not_p2sh);
  pushdata1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pushdata1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_120 = &pushdata2;
  pushdata2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "CScript(direct.begin(), direct.end()).IsPayToScriptHash()";
  pushdata2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  local_138.m_message.px = (element_type *)((ulong)local_138.m_message.px & 0xffffffffffffff00);
  local_138._0_8_ = &PTR__lazy_ostream_0113a070;
  local_138.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_140 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&pushdata1,(lazy_ostream *)&local_138,1,0,WARN,_cVar7,
             (size_t)&local_148,0xe5);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &pushdata1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&not_p2sh.super_CScriptBase);
  not_p2sh.super_CScriptBase._union._0_3_ = 0x144ca9;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&not_p2sh;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&pushdata1,__l_00,(allocator_type *)&local_138);
  not_p2sh.super_CScriptBase._union.indirect_contents.indirect =
       (char *)((ulong)not_p2sh.super_CScriptBase._union.indirect_contents.indirect &
               0xffffffffffffff00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
            (&pushdata1,
             (const_iterator)
             pushdata1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,0x14,(value_type_conflict3 *)&not_p2sh);
  not_p2sh.super_CScriptBase._union.direct[0] = 0x87;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&pushdata1,(uchar *)&not_p2sh);
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_150 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar6;
  msg_01.m_begin = pvVar5;
  file_01.m_end = (iterator)0xeb;
  file_01.m_begin = (iterator)&local_158;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_168,
             msg_01);
  first._M_current._1_7_ =
       pushdata1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  first._M_current._0_1_ =
       pushdata1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::
  prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            (&not_p2sh.super_CScriptBase,first,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )pushdata1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
  bVar3 = CScript::IsPayToScriptHash(&not_p2sh);
  pushdata2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(pushdata2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,!bVar3);
  pushdata2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pushdata2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_120 = &pushdata4;
  pushdata4.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       "!CScript(pushdata1.begin(), pushdata1.end()).IsPayToScriptHash()";
  pushdata4.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  local_138.m_message.px = (element_type *)((ulong)local_138.m_message.px & 0xffffffffffffff00);
  local_138._0_8_ = &PTR__lazy_ostream_0113a070;
  local_138.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_190 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_188 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&pushdata2,(lazy_ostream *)&local_138,1,0,WARN,_cVar7,
             (size_t)&local_190,0xeb);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &pushdata2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&not_p2sh.super_CScriptBase);
  not_p2sh.super_CScriptBase._union._0_4_ = 0x144da9;
  __l_01._M_len = 4;
  __l_01._M_array = (iterator)&not_p2sh;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&pushdata2,__l_01,(allocator_type *)&local_138);
  not_p2sh.super_CScriptBase._union.indirect_contents.indirect =
       (char *)((ulong)not_p2sh.super_CScriptBase._union.indirect_contents.indirect &
               0xffffffffffffff00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
            (&pushdata2,
             (const_iterator)
             pushdata2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,0x14,(value_type_conflict3 *)&not_p2sh);
  not_p2sh.super_CScriptBase._union.direct[0] = 0x87;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&pushdata2,(uchar *)&not_p2sh);
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar6;
  msg_02.m_begin = pvVar5;
  file_02.m_end = (iterator)0xef;
  file_02.m_begin = (iterator)&local_1a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1b0,
             msg_02);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::
  prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            (&not_p2sh.super_CScriptBase,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )pushdata2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )pushdata2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
  bVar3 = CScript::IsPayToScriptHash(&not_p2sh);
  pushdata4.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(pushdata4.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,!bVar3);
  pushdata4.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pushdata4.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_120 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_210;
  local_210._0_8_ = "!CScript(pushdata2.begin(), pushdata2.end()).IsPayToScriptHash()";
  local_210.m_message.px = (element_type *)0xbc1ddd;
  local_138.m_message.px = (element_type *)((ulong)local_138.m_message.px & 0xffffffffffffff00);
  local_138._0_8_ = &PTR__lazy_ostream_0113a070;
  local_138.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1d0 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&pushdata4,(lazy_ostream *)&local_138,1,0,WARN,_cVar7,
             (size_t)&local_1d8,0xef);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &pushdata4.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&not_p2sh.super_CScriptBase);
  not_p2sh.super_CScriptBase._union._0_6_ = 0x144ea9;
  __l_02._M_len = 6;
  __l_02._M_array = (iterator)&not_p2sh;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&pushdata4,__l_02,(allocator_type *)&local_138);
  not_p2sh.super_CScriptBase._union.indirect_contents.indirect =
       (char *)((ulong)not_p2sh.super_CScriptBase._union.indirect_contents.indirect &
               0xffffffffffffff00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
            (&pushdata4,
             (const_iterator)
             pushdata4.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,0x14,(value_type_conflict3 *)&not_p2sh);
  not_p2sh.super_CScriptBase._union.direct[0] = 0x87;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&pushdata4,(uchar *)&not_p2sh);
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1e0 = "";
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar6;
  msg_03.m_begin = pvVar5;
  file_03.m_end = (iterator)0xf3;
  file_03.m_begin = (iterator)&local_1e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1f8,
             msg_03);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::
  prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            (&not_p2sh.super_CScriptBase,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )pushdata4.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )pushdata4.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
  bVar3 = CScript::IsPayToScriptHash(&not_p2sh);
  local_210.m_message.px = (element_type *)0x0;
  local_210.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_220 = "!CScript(pushdata4.begin(), pushdata4.end()).IsPayToScriptHash()";
  local_218 = "";
  local_138.m_message.px = (element_type *)((ulong)local_138.m_message.px & 0xffffffffffffff00);
  local_138._0_8_ = &PTR__lazy_ostream_0113a070;
  local_138.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_230 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_228 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_120 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_220;
  local_210.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar3;
  boost::test_tools::tt_detail::report_assertion
            (&local_210,(lazy_ostream *)&local_138,1,0,WARN,_cVar7,(size_t)&local_230,0xf3);
  boost::detail::shared_count::~shared_count(&local_210.m_message.pn);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&not_p2sh.super_CScriptBase);
  not_p2sh.super_CScriptBase._union._16_8_ = 0;
  not_p2sh.super_CScriptBase._24_8_ = 0;
  not_p2sh.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  not_p2sh.super_CScriptBase._union._8_8_ = 0;
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar6;
  msg_04.m_begin = pvVar5;
  file_04.m_end = (iterator)0xf6;
  file_04.m_begin = (iterator)&local_240;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_250,
             msg_04);
  bVar3 = CScript::IsPayToScriptHash(&not_p2sh);
  local_210.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar3;
  local_210.m_message.px = (element_type *)0x0;
  local_210.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_220 = "!not_p2sh.IsPayToScriptHash()";
  local_218 = "";
  local_138.m_message.px = (element_type *)((ulong)local_138.m_message.px & 0xffffffffffffff00);
  local_138._0_8_ = &PTR__lazy_ostream_0113a070;
  local_138.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_260 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_258 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_120 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_220;
  boost::test_tools::tt_detail::report_assertion
            (&local_210,(lazy_ostream *)&local_138,1,0,WARN,_cVar7,(size_t)&local_260,0xf6);
  boost::detail::shared_count::~shared_count(&local_210.m_message.pn);
  CScript::clear(&not_p2sh);
  pCVar4 = CScript::operator<<(&not_p2sh,OP_HASH160);
  ToByteVector<uint160>((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_138,&dummy);
  b_00._M_extent._M_extent_value = (long)local_138.m_message.px - local_138._0_8_;
  b_00._M_ptr = (pointer)local_138._0_8_;
  pCVar4 = CScript::operator<<(pCVar4,b_00);
  ToByteVector<uint160>((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_210,&dummy);
  b_01._M_extent._M_extent_value = (long)local_210.m_message.px - local_210._0_8_;
  b_01._M_ptr = (pointer)local_210._0_8_;
  pCVar4 = CScript::operator<<(pCVar4,b_01);
  CScript::operator<<(pCVar4,OP_EQUAL);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_210);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_138);
  local_270 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_268 = "";
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar6;
  msg_05.m_begin = pvVar5;
  file_05.m_end = (iterator)0xf9;
  file_05.m_begin = (iterator)&local_270;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_280,
             msg_05);
  bVar3 = CScript::IsPayToScriptHash(&not_p2sh);
  local_210.m_message.px = (element_type *)0x0;
  local_210.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_220 = "!not_p2sh.IsPayToScriptHash()";
  local_218 = "";
  local_138.m_message.px = (element_type *)((ulong)local_138.m_message.px & 0xffffffffffffff00);
  local_138._0_8_ = &PTR__lazy_ostream_0113a070;
  local_138.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_290 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_288 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_120 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_220;
  local_210.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar3;
  boost::test_tools::tt_detail::report_assertion
            (&local_210,(lazy_ostream *)&local_138,1,0,WARN,_cVar7,(size_t)&local_290,0xf9);
  boost::detail::shared_count::~shared_count(&local_210.m_message.pn);
  CScript::clear(&not_p2sh);
  pCVar4 = CScript::operator<<(&not_p2sh,OP_NOP);
  ToByteVector<uint160>((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_138,&dummy);
  b_02._M_extent._M_extent_value = (long)local_138.m_message.px - local_138._0_8_;
  b_02._M_ptr = (pointer)local_138._0_8_;
  pCVar4 = CScript::operator<<(pCVar4,b_02);
  CScript::operator<<(pCVar4,OP_EQUAL);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_138);
  local_2a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_298 = "";
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar6;
  msg_06.m_begin = pvVar5;
  file_06.m_end = (iterator)0xfc;
  file_06.m_begin = (iterator)&local_2a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_2b0,
             msg_06);
  bVar3 = CScript::IsPayToScriptHash(&not_p2sh);
  local_210.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar3;
  local_210.m_message.px = (element_type *)0x0;
  local_210.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_220 = "!not_p2sh.IsPayToScriptHash()";
  local_218 = "";
  local_138.m_message.px = (element_type *)((ulong)local_138.m_message.px & 0xffffffffffffff00);
  local_138._0_8_ = &PTR__lazy_ostream_0113a070;
  local_138.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_2b8 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_120 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_220;
  boost::test_tools::tt_detail::report_assertion
            (&local_210,(lazy_ostream *)&local_138,1,0,WARN,_cVar7,(size_t)&local_2c0,0xfc);
  boost::detail::shared_count::~shared_count(&local_210.m_message.pn);
  CScript::clear(&not_p2sh);
  pCVar4 = CScript::operator<<(&not_p2sh,OP_HASH160);
  ToByteVector<uint160>((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_138,&dummy);
  b_03._M_extent._M_extent_value = (long)local_138.m_message.px - local_138._0_8_;
  b_03._M_ptr = (pointer)local_138._0_8_;
  pCVar4 = CScript::operator<<(pCVar4,b_03);
  CScript::operator<<(pCVar4,OP_CHECKSIG);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_138);
  local_2d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_2c8 = "";
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = pvVar6;
  msg_07.m_begin = pvVar5;
  file_07.m_end = (iterator)0xff;
  file_07.m_begin = (iterator)&local_2d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_2e0,
             msg_07);
  bVar3 = CScript::IsPayToScriptHash(&not_p2sh);
  local_210.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar3;
  local_210.m_message.px = (element_type *)0x0;
  local_210.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_220 = "!not_p2sh.IsPayToScriptHash()";
  local_218 = "";
  local_138.m_message.px = (element_type *)((ulong)local_138.m_message.px & 0xffffffffffffff00);
  local_138._0_8_ = &PTR__lazy_ostream_0113a070;
  local_138.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_120 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_220;
  boost::test_tools::tt_detail::report_assertion
            (&local_210,(lazy_ostream *)&local_138,1,0,WARN,0xbc1ba0,
             (size_t)&stack0xfffffffffffffd10,0xff);
  boost::detail::shared_count::~shared_count(&local_210.m_message.pn);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&not_p2sh.super_CScriptBase);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&pushdata4.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&pushdata2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&pushdata1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&direct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&p2sh.super_CScriptBase);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(is)
{
    // Test CScript::IsPayToScriptHash()
    uint160 dummy;
    CScript p2sh;
    p2sh << OP_HASH160 << ToByteVector(dummy) << OP_EQUAL;
    BOOST_CHECK(p2sh.IsPayToScriptHash());

    std::vector<unsigned char> direct = {OP_HASH160, 20};
    direct.insert(direct.end(), 20, 0);
    direct.push_back(OP_EQUAL);
    BOOST_CHECK(CScript(direct.begin(), direct.end()).IsPayToScriptHash());

    // Not considered pay-to-script-hash if using one of the OP_PUSHDATA opcodes:
    std::vector<unsigned char> pushdata1 = {OP_HASH160, OP_PUSHDATA1, 20};
    pushdata1.insert(pushdata1.end(), 20, 0);
    pushdata1.push_back(OP_EQUAL);
    BOOST_CHECK(!CScript(pushdata1.begin(), pushdata1.end()).IsPayToScriptHash());
    std::vector<unsigned char> pushdata2 = {OP_HASH160, OP_PUSHDATA2, 20, 0};
    pushdata2.insert(pushdata2.end(), 20, 0);
    pushdata2.push_back(OP_EQUAL);
    BOOST_CHECK(!CScript(pushdata2.begin(), pushdata2.end()).IsPayToScriptHash());
    std::vector<unsigned char> pushdata4 = {OP_HASH160, OP_PUSHDATA4, 20, 0, 0, 0};
    pushdata4.insert(pushdata4.end(), 20, 0);
    pushdata4.push_back(OP_EQUAL);
    BOOST_CHECK(!CScript(pushdata4.begin(), pushdata4.end()).IsPayToScriptHash());

    CScript not_p2sh;
    BOOST_CHECK(!not_p2sh.IsPayToScriptHash());

    not_p2sh.clear(); not_p2sh << OP_HASH160 << ToByteVector(dummy) << ToByteVector(dummy) << OP_EQUAL;
    BOOST_CHECK(!not_p2sh.IsPayToScriptHash());

    not_p2sh.clear(); not_p2sh << OP_NOP << ToByteVector(dummy) << OP_EQUAL;
    BOOST_CHECK(!not_p2sh.IsPayToScriptHash());

    not_p2sh.clear(); not_p2sh << OP_HASH160 << ToByteVector(dummy) << OP_CHECKSIG;
    BOOST_CHECK(!not_p2sh.IsPayToScriptHash());
}